

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void FS_TakeInventory(AActor *actor,char *type,int amount)

{
  int iVar1;
  PClassActor *type_00;
  AInventory *this;
  MetaClass *pMVar2;
  AInventory *item;
  PClassActor *info;
  char *pcStack_18;
  int amount_local;
  char *type_local;
  AActor *actor_local;
  
  iVar1 = strcmp(type,"Armor");
  pcStack_18 = type;
  if (iVar1 == 0) {
    pcStack_18 = "BasicArmor";
  }
  if ((((0 < amount) && (type_00 = PClass::FindActor(pcStack_18), type_00 != (PClassActor *)0x0)) &&
      (this = AActor::FindInventory(actor,type_00,false), this != (AInventory *)0x0)) &&
     (this->Amount = this->Amount - amount, this->Amount < 1)) {
    pMVar2 = AInventory::GetClass(this);
    if ((pMVar2->super_PClassActor).super_PClass.ParentClass == AAmmo::RegistrationInfo.MyClass) {
      this->Amount = 0;
    }
    else {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    }
  }
  return;
}

Assistant:

static void FS_TakeInventory (AActor *actor, const char * type, int amount)
{
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	if (amount <= 0)
	{
		return;
	}
	PClassActor * info = PClass::FindActor (type);
	if (info == NULL)
	{
		return;
	}

	AInventory *item = actor->FindInventory (info);
	if (item != NULL)
	{
		item->Amount -= amount;
		if (item->Amount <= 0)
		{
			// If it's not ammo, destroy it. Ammo needs to stick around, even
			// when it's zero for the benefit of the weapons that use it and 
			// to maintain the maximum ammo amounts a backpack might have given.
			if (item->GetClass()->ParentClass != RUNTIME_CLASS(AAmmo))
			{
				item->Destroy ();
			}
			else
			{
				item->Amount = 0;
			}
		}
	}
}